

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_enc.c
# Opt level: O0

int EVP_EncryptUpdate(EVP_CIPHER_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  int blocksize;
  size_t soutl;
  int ret;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar1;
  undefined8 in_stack_ffffffffffffffa8;
  int iVar3;
  code *pcVar2;
  uchar *in_stack_ffffffffffffffb0;
  EVP_CIPHER *file;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  EVP_CIPHER_CTX *in_stack_ffffffffffffffc8;
  int local_4;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (outl == (int *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffb0,iVar3,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(6,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else {
    *outl = 0;
    if (ctx->encrypt == 0) {
      ERR_new();
      ERR_set_debug((char *)in_stack_ffffffffffffffb0,iVar3,
                    (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      ERR_set_error(6,0x94,(char *)0x0);
      local_4 = 0;
    }
    else if (ctx->cipher == (EVP_CIPHER *)0x0) {
      ERR_new();
      ERR_set_debug((char *)in_stack_ffffffffffffffb0,iVar3,
                    (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      ERR_set_error(6,0x83,(char *)0x0);
      local_4 = 0;
    }
    else if (ctx->cipher[1].do_cipher == (_func_1090 *)0x0) {
      local_4 = evp_EncryptDecryptUpdate
                          (in_stack_ffffffffffffffc8,
                           (uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar3);
    }
    else {
      iVar1 = ctx->cipher->block_size;
      if ((ctx->cipher[1].app_data == (void *)0x0) || (iVar1 < 1)) {
        ERR_new();
        ERR_set_debug((char *)in_stack_ffffffffffffffb0,iVar3,
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        ERR_set_error(6,0xbd,(char *)0x0);
        local_4 = 0;
      }
      else {
        pcVar2 = (code *)ctx->cipher[1].app_data;
        file = ctx[1].cipher;
        if (iVar1 == 1) {
          iVar1 = 0;
        }
        local_4 = (*pcVar2)(file,out,&stack0xffffffffffffffc8,(long)(inl + iVar1),in,(long)inl);
        iVar3 = (int)((ulong)pcVar2 >> 0x20);
        if (local_4 != 0) {
          if (in_stack_ffffffffffffffc8 < (EVP_CIPHER_CTX *)0x80000000) {
            *outl = (int)in_stack_ffffffffffffffc8;
          }
          else {
            ERR_new();
            ERR_set_debug((char *)file,iVar3,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
            ERR_set_error(6,0xbd,(char *)0x0);
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int EVP_EncryptUpdate(EVP_CIPHER_CTX *ctx, unsigned char *out, int *outl,
                      const unsigned char *in, int inl)
{
    int ret;
    size_t soutl;
    int blocksize;

    if (outl != NULL) {
        *outl = 0;
    } else {
        ERR_raise(ERR_LIB_EVP, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    /* Prevent accidental use of decryption context when encrypting */
    if (!ctx->encrypt) {
        ERR_raise(ERR_LIB_EVP, EVP_R_INVALID_OPERATION);
        return 0;
    }

    if (ctx->cipher == NULL) {
        ERR_raise(ERR_LIB_EVP, EVP_R_NO_CIPHER_SET);
        return 0;
    }

    if (ctx->cipher->prov == NULL)
        goto legacy;

    blocksize = ctx->cipher->block_size;

    if (ctx->cipher->cupdate == NULL  || blocksize < 1) {
        ERR_raise(ERR_LIB_EVP, EVP_R_UPDATE_ERROR);
        return 0;
    }
    ret = ctx->cipher->cupdate(ctx->algctx, out, &soutl,
                               inl + (blocksize == 1 ? 0 : blocksize), in,
                               (size_t)inl);

    if (ret) {
        if (soutl > INT_MAX) {
            ERR_raise(ERR_LIB_EVP, EVP_R_UPDATE_ERROR);
            return 0;
        }
        *outl = soutl;
    }

    return ret;

    /* Code below to be removed when legacy support is dropped. */
 legacy:

    return evp_EncryptDecryptUpdate(ctx, out, outl, in, inl);
}